

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip.h
# Opt level: O0

int bip_finish_read(uint32_t size,bip *buffer)

{
  uint uVar1;
  uint uVar2;
  uint32_t write;
  char full_r2;
  uint32_t write_;
  uint32_t read;
  bip *buffer_local;
  uint32_t size_local;
  
  uVar1 = buffer->read;
  uVar2 = buffer->write & 0x7fffffff;
  if ((int)buffer->write < 0) {
    if (buffer->size - uVar1 < size) {
      mixed_err(0x12);
      return 0;
    }
    LOCK();
    buffer->read = uVar1 + size;
    UNLOCK();
  }
  else if (uVar1 < uVar2) {
    if (uVar2 - uVar1 < size) {
      mixed_err(0x12);
      return 0;
    }
    LOCK();
    buffer->read = uVar1 + size;
    UNLOCK();
  }
  else if (size != 0) {
    mixed_err(0x12);
    return 0;
  }
  return 1;
}

Assistant:

static inline int bip_finish_read(uint32_t size, struct bip *buffer){
  read_buffer_state(read, write, full_r2, buffer);
  if(full_r2){
    if(buffer->size-read < size){
      mixed_err(MIXED_BUFFER_OVERCOMMIT);
      return 0;
    }else{
      atomic_write(buffer->read, read+size);
    }
  }else if(read<write){
    if(write-read < size){
      mixed_err(MIXED_BUFFER_OVERCOMMIT);
      return 0;
    }
    atomic_write(buffer->read, read+size);
  }else if(0 < size){
    mixed_err(MIXED_BUFFER_OVERCOMMIT);
    return 0;
  }
  return 1;
}